

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void likeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3_context *pCtx;
  int iVar1;
  uchar *local_50;
  uchar *zEsc;
  compareInfo *pInfo;
  sqlite3 *db;
  int nPat;
  u32 escape;
  uchar *zB;
  uchar *zA;
  sqlite3_value **argv_local;
  sqlite3_context *psStack_10;
  int argc_local;
  sqlite3_context *context_local;
  
  zA = (uchar *)argv;
  argv_local._4_4_ = argc;
  psStack_10 = context;
  pInfo = (compareInfo *)sqlite3_context_db_handle(context);
  zEsc = (uchar *)sqlite3_user_data(psStack_10);
  _nPat = sqlite3_value_text(*(sqlite3_value **)zA);
  zB = sqlite3_value_text(*(sqlite3_value **)(zA + 8));
  db._0_4_ = sqlite3_value_bytes(*(sqlite3_value **)zA);
  if ((int)pInfo[0x24] < (int)db) {
    sqlite3_result_error(psStack_10,"LIKE or GLOB pattern too complex",-1);
    return;
  }
  if (argv_local._4_4_ == 3) {
    local_50 = sqlite3_value_text(*(sqlite3_value **)(zA + 0x10));
    if (local_50 == (uchar *)0x0) {
      return;
    }
    iVar1 = sqlite3Utf8CharLen((char *)local_50,-1);
    if (iVar1 != 1) {
      sqlite3_result_error(psStack_10,"ESCAPE expression must be a single character",-1);
      return;
    }
    db._4_4_ = sqlite3Utf8Read(&local_50);
  }
  else {
    db._4_4_ = (u32)zEsc[2];
  }
  pCtx = psStack_10;
  if ((zB != (uchar *)0x0) && (_nPat != (u8 *)0x0)) {
    iVar1 = patternCompare(_nPat,zB,(compareInfo *)zEsc,db._4_4_);
    sqlite3_result_int(pCtx,(uint)(iVar1 == 0));
  }
  return;
}

Assistant:

static void likeFunc(
  sqlite3_context *context, 
  int argc, 
  sqlite3_value **argv
){
  const unsigned char *zA, *zB;
  u32 escape;
  int nPat;
  sqlite3 *db = sqlite3_context_db_handle(context);
  struct compareInfo *pInfo = sqlite3_user_data(context);

#ifdef SQLITE_LIKE_DOESNT_MATCH_BLOBS
  if( sqlite3_value_type(argv[0])==SQLITE_BLOB
   || sqlite3_value_type(argv[1])==SQLITE_BLOB
  ){
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    sqlite3_result_int(context, 0);
    return;
  }
#endif
  zB = sqlite3_value_text(argv[0]);
  zA = sqlite3_value_text(argv[1]);

  /* Limit the length of the LIKE or GLOB pattern to avoid problems
  ** of deep recursion and N*N behavior in patternCompare().
  */
  nPat = sqlite3_value_bytes(argv[0]);
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] );
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH]+1 );
  if( nPat > db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] ){
    sqlite3_result_error(context, "LIKE or GLOB pattern too complex", -1);
    return;
  }
  assert( zB==sqlite3_value_text(argv[0]) );  /* Encoding did not change */

  if( argc==3 ){
    /* The escape character string must consist of a single UTF-8 character.
    ** Otherwise, return an error.
    */
    const unsigned char *zEsc = sqlite3_value_text(argv[2]);
    if( zEsc==0 ) return;
    if( sqlite3Utf8CharLen((char*)zEsc, -1)!=1 ){
      sqlite3_result_error(context, 
          "ESCAPE expression must be a single character", -1);
      return;
    }
    escape = sqlite3Utf8Read(&zEsc);
  }else{
    escape = pInfo->matchSet;
  }
  if( zA && zB ){
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    sqlite3_result_int(context, patternCompare(zB, zA, pInfo, escape)==SQLITE_MATCH);
  }
}